

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall AtomicHash::AtomicHash(AtomicHash *this)

{
  long in_RDI;
  int i;
  memory_order __b;
  undefined4 local_2c;
  
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    *(undefined8 *)(in_RDI + (long)local_2c * 8) = 0;
    UNLOCK();
  }
  return;
}

Assistant:

AtomicHash() {
		for (int i = 0; i < 4; ++i)
			hash[i].store(0);
	}